

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O1

DdNode * cuddAddPermuteRecur(DdManager *manager,DdHashTable *table,DdNode *node,int *permut)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *h;
  DdNode *f;
  DdNode *value;
  
  if (node->index == 0x7fffffff) {
    return node;
  }
  if ((node->ref != 1) && (pDVar3 = cuddHashTableLookup1(table,node), pDVar3 != (DdNode *)0x0)) {
    return pDVar3;
  }
  pDVar3 = cuddAddPermuteRecur(manager,table,(node->type).kids.T,permut);
  if (pDVar3 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    h = cuddAddPermuteRecur(manager,table,(node->type).kids.E,permut);
    value = pDVar3;
    if (h != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      f = cuddUniqueInter(manager,permut[node->index],manager->one,manager->zero);
      if (f == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      value = cuddAddIteRecur(manager,f,pDVar3,h);
      if (value == (DdNode *)0x0) {
        Cudd_RecursiveDeref(manager,f);
        Cudd_RecursiveDeref(manager,pDVar3);
        value = h;
      }
      else {
        piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(manager,f);
        Cudd_RecursiveDeref(manager,pDVar3);
        Cudd_RecursiveDeref(manager,h);
        if (((ulong)node->ref == 1) ||
           (iVar2 = cuddHashTableInsert1(table,node,value,(ulong)node->ref - 1), iVar2 != 0)) {
          piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          return value;
        }
      }
    }
    Cudd_RecursiveDeref(manager,value);
  }
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
cuddAddPermuteRecur(
  DdManager * manager /* DD manager */,
  DdHashTable * table /* computed table */,
  DdNode * node /* ADD to be reordered */,
  int * permut /* permutation array */)
{
    DdNode      *T,*E;
    DdNode      *res,*var;
    int         index;
    
    statLine(manager);
    /* Check for terminal case of constant node. */
    if (cuddIsConstant(node)) {
        return(node);
    }

    /* If problem already solved, look up answer and return. */
    if (node->ref != 1 && (res = cuddHashTableLookup1(table,node)) != NULL) {
#ifdef DD_DEBUG
        addPermuteRecurHits++;
#endif
        return(res);
    }

    /* Split and recur on children of this node. */
    T = cuddAddPermuteRecur(manager,table,cuddT(node),permut);
    if (T == NULL) return(NULL);
    cuddRef(T);
    E = cuddAddPermuteRecur(manager,table,cuddE(node),permut);
    if (E == NULL) {
        Cudd_RecursiveDeref(manager, T);
        return(NULL);
    }
    cuddRef(E);

    /* Move variable that should be in this position to this position
    ** by creating a single var ADD for that variable, and calling
    ** cuddAddIteRecur with the T and E we just created.
    */
    index = permut[node->index];
    var = cuddUniqueInter(manager,index,DD_ONE(manager),DD_ZERO(manager));
    if (var == NULL) return(NULL);
    cuddRef(var);
    res = cuddAddIteRecur(manager,var,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(manager,var);
        Cudd_RecursiveDeref(manager, T);
        Cudd_RecursiveDeref(manager, E);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(manager,var);
    Cudd_RecursiveDeref(manager, T);
    Cudd_RecursiveDeref(manager, E);

    /* Do not keep the result if the reference count is only 1, since
    ** it will not be visited again.
    */
    if (node->ref != 1) {
        ptrint fanout = (ptrint) node->ref;
        cuddSatDec(fanout);
        if (!cuddHashTableInsert1(table,node,res,fanout)) {
            Cudd_RecursiveDeref(manager, res);
            return(NULL);
        }
    }
    cuddDeref(res);
    return(res);

}